

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toinst.cpp
# Opt level: O1

unique_ptr<llvm::Instruction,_std::function<void_(llvm::Instruction_*)>_> *
toInst(unique_ptr<llvm::Instruction,_std::function<void_(llvm::Instruction_*)>_>
       *__return_storage_ptr__,ConstantExpr *ce)

{
  Instruction *pIVar1;
  
  pIVar1 = (Instruction *)llvm::ConstantExpr::getAsInstruction((Instruction *)ce);
  *(undefined8 *)
   &(__return_storage_ptr__->_M_t).
    super___uniq_ptr_impl<llvm::Instruction,_std::function<void_(llvm::Instruction_*)>_>._M_t.
    super__Tuple_impl<0UL,_llvm::Instruction_*,_std::function<void_(llvm::Instruction_*)>_>.
    super__Tuple_impl<1UL,_std::function<void_(llvm::Instruction_*)>_>.
    super__Head_base<1UL,_std::function<void_(llvm::Instruction_*)>,_false>._M_head_impl = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->_M_t).
           super___uniq_ptr_impl<llvm::Instruction,_std::function<void_(llvm::Instruction_*)>_>._M_t
           .super__Tuple_impl<0UL,_llvm::Instruction_*,_std::function<void_(llvm::Instruction_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(llvm::Instruction_*)>_>.
           super__Head_base<1UL,_std::function<void_(llvm::Instruction_*)>,_false>._M_head_impl + 8)
       = 0;
  *(code **)((long)&(__return_storage_ptr__->_M_t).
                    super___uniq_ptr_impl<llvm::Instruction,_std::function<void_(llvm::Instruction_*)>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_llvm::Instruction_*,_std::function<void_(llvm::Instruction_*)>_>
                    .super__Tuple_impl<1UL,_std::function<void_(llvm::Instruction_*)>_>.
                    super__Head_base<1UL,_std::function<void_(llvm::Instruction_*)>,_false>.
                    _M_head_impl + 0x18) =
       std::
       _Function_handler<void_(llvm::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/staticafi[P]llvm2c/parser/toinst.cpp:7:9)>
       ::_M_invoke;
  *(code **)((long)&(__return_storage_ptr__->_M_t).
                    super___uniq_ptr_impl<llvm::Instruction,_std::function<void_(llvm::Instruction_*)>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_llvm::Instruction_*,_std::function<void_(llvm::Instruction_*)>_>
                    .super__Tuple_impl<1UL,_std::function<void_(llvm::Instruction_*)>_>.
                    super__Head_base<1UL,_std::function<void_(llvm::Instruction_*)>,_false>.
                    _M_head_impl + 0x10) =
       std::
       _Function_handler<void_(llvm::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/staticafi[P]llvm2c/parser/toinst.cpp:7:9)>
       ::_M_manager;
  (__return_storage_ptr__->_M_t).
  super___uniq_ptr_impl<llvm::Instruction,_std::function<void_(llvm::Instruction_*)>_>._M_t.
  super__Tuple_impl<0UL,_llvm::Instruction_*,_std::function<void_(llvm::Instruction_*)>_>.
  super__Head_base<0UL,_llvm::Instruction_*,_false>._M_head_impl = pIVar1;
  return __return_storage_ptr__;
}

Assistant:

std::unique_ptr<llvm::Instruction, std::function<void(llvm::Instruction*)>> toInst(
    llvm::ConstantExpr* ce){
    return std::unique_ptr<llvm::Instruction, std::function<void(llvm::Instruction*)>>(
        ce->getAsInstruction(),
        [](llvm::Instruction* inst) { inst->deleteValue(); }
    );
}